

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::AssertionStats::AssertionStats
          (AssertionStats *this,AssertionResult *_assertionResult,
          vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *_infoMessages,
          Totals *_totals)

{
  bool bVar1;
  OfType type;
  AssertionResult *this_00;
  string local_f8;
  string local_d8;
  SourceLineInfo local_b8;
  StringRef local_a8;
  undefined1 local_98 [8];
  MessageBuilder builder;
  Totals *_totals_local;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *_infoMessages_local;
  AssertionResult *_assertionResult_local;
  AssertionStats *this_local;
  
  this->_vptr_AssertionStats = (_func_int **)&PTR__AssertionStats_0023de60;
  AssertionResult::AssertionResult(&this->assertionResult,_assertionResult);
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector
            (&this->infoMessages,_infoMessages);
  memcpy(&this->totals,_totals,0x38);
  (this->assertionResult).m_resultData.lazyExpression.m_transientExpression =
       (_assertionResult->m_resultData).lazyExpression.m_transientExpression;
  bVar1 = AssertionResult::hasMessage(&this->assertionResult);
  if (bVar1) {
    this_00 = &this->assertionResult;
    local_a8 = AssertionResult::getTestMacroName(this_00);
    local_b8 = AssertionResult::getSourceInfo(this_00);
    type = AssertionResult::getResultType(this_00);
    MessageBuilder::MessageBuilder((MessageBuilder *)local_98,&local_a8,&local_b8,type);
    AssertionResult::getMessage_abi_cxx11_(&local_d8,&this->assertionResult);
    MessageBuilder::operator<<((MessageBuilder *)local_98,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    ReusableStringStream::str_abi_cxx11_(&local_f8,(ReusableStringStream *)local_98);
    clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
    operator=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &builder.m_info.macroName.m_size,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::push_back
              (&this->infoMessages,(value_type *)&builder.super_MessageStream.m_stream.m_oss);
    MessageBuilder::~MessageBuilder((MessageBuilder *)local_98);
  }
  return;
}

Assistant:

AssertionStats::AssertionStats( AssertionResult const& _assertionResult,
                                     std::vector<MessageInfo> const& _infoMessages,
                                     Totals const& _totals )
    :   assertionResult( _assertionResult ),
        infoMessages( _infoMessages ),
        totals( _totals )
    {
        assertionResult.m_resultData.lazyExpression.m_transientExpression = _assertionResult.m_resultData.lazyExpression.m_transientExpression;

        if( assertionResult.hasMessage() ) {
            // Copy message into messages list.
            // !TBD This should have been done earlier, somewhere
            MessageBuilder builder( assertionResult.getTestMacroName(), assertionResult.getSourceInfo(), assertionResult.getResultType() );
            builder << assertionResult.getMessage();
            builder.m_info.message = builder.m_stream.str();

            infoMessages.push_back( builder.m_info );
        }
    }